

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O0

void __thiscall
xray_re::xr_mesh_vbuf::extend<xray_re::_color<float>>
          (xr_mesh_vbuf *this,_color<float> **source,size_t new_size)

{
  _color<float> *source_00;
  undefined1 auVar1 [16];
  ulong uVar2;
  _color<float> *target_00;
  size_t size;
  _color<float> *target;
  size_t new_size_local;
  _color<float> **source_local;
  xr_mesh_vbuf *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = new_size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  target_00 = (_color<float> *)operator_new__(uVar2);
  if (*source != (_color<float> *)0x0) {
    source_00 = *source;
    size = xr_flexbuf::size((xr_flexbuf *)this);
    xr_flexbuf::copy<xray_re::_color<float>>((xr_flexbuf *)this,source_00,target_00,size);
  }
  if (*source != (_color<float> *)0x0) {
    operator_delete(*source,0x10);
  }
  *source = target_00;
  return;
}

Assistant:

void xr_mesh_vbuf::extend(T*& source, size_t new_size)
{
	T* target = new T[new_size];
	if (source)
		copy(source, target, size());
	delete source;
	source = target;
}